

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trace-type-impl.cpp
# Opt level: O0

void __thiscall
yactfr::internal::SetKeyDtsDtVisitor::_setKeyDtsVar<yactfr::VariantWithUnsignedIntegerSelectorType>
          (SetKeyDtsDtVisitor *this,VariantWithUnsignedIntegerSelectorType *dt,DataLocation *loc,
          const_iterator locIt,DataTypeSet *dts)

{
  bool bVar1;
  Options *this_00;
  reference this_01;
  pointer this_02;
  pointer pvVar2;
  Option *this_03;
  DataType *pDVar3;
  unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>
  *opt;
  const_iterator __end0;
  const_iterator __begin0;
  Options *__range4;
  key_type local_40;
  _Node_iterator_base<std::pair<const_yactfr::DataType_*const,_unsigned_long_long>,_false> local_38;
  const_iterator it;
  DataTypeSet *dts_local;
  DataLocation *loc_local;
  VariantWithUnsignedIntegerSelectorType *dt_local;
  SetKeyDtsDtVisitor *this_local;
  const_iterator locIt_local;
  
  local_40 = (key_type)dt;
  it.super__Node_iterator_base<std::pair<const_yactfr::DataType_*const,_unsigned_long_long>,_false>.
  _M_cur = (_Node_iterator_base<std::pair<const_yactfr::DataType_*const,_unsigned_long_long>,_false>
           )(_Node_iterator_base<std::pair<const_yactfr::DataType_*const,_unsigned_long_long>,_false>
             )dts;
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_map<const_yactfr::DataType_*,_unsigned_long_long,_std::hash<const_yactfr::DataType_*>,_std::equal_to<const_yactfr::DataType_*>,_std::allocator<std::pair<const_yactfr::DataType_*const,_unsigned_long_long>_>_>
       ::find(&this->_current,&local_40);
  __range4 = (Options *)
             std::
             unordered_map<const_yactfr::DataType_*,_unsigned_long_long,_std::hash<const_yactfr::DataType_*>,_std::equal_to<const_yactfr::DataType_*>,_std::allocator<std::pair<const_yactfr::DataType_*const,_unsigned_long_long>_>_>
             ::end(&this->_current);
  bVar1 = std::__detail::operator==
                    (&local_38,
                     (_Node_iterator_base<std::pair<const_yactfr::DataType_*const,_unsigned_long_long>,_false>
                      *)&__range4);
  if (bVar1) {
    this_00 = VariantWithIntegerSelectorType<unsigned_long_long>::options
                        (&dt->super_VariantWithIntegerSelectorType<unsigned_long_long>);
    __end0 = std::
             vector<std::unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>,_std::allocator<std::unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>_>_>
             ::begin(this_00);
    opt = (unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>
           *)std::
             vector<std::unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>,_std::allocator<std::unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>_>_>
             ::end(this_00);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end0,(__normal_iterator<const_std::unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>_*,_std::vector<std::unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>,_std::allocator<std::unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>_>_>_>
                                       *)&opt), bVar1) {
      this_01 = __gnu_cxx::
                __normal_iterator<const_std::unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>_*,_std::vector<std::unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>,_std::allocator<std::unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>_>_>_>
                ::operator*(&__end0);
      this_02 = std::
                unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>
                ::operator->(this_01);
      pDVar3 = VariantTypeOption<unsigned_long_long>::dataType(this_02);
      _setKeyDts(this,pDVar3,loc,locIt,
                 (DataTypeSet *)
                 it.
                 super__Node_iterator_base<std::pair<const_yactfr::DataType_*const,_unsigned_long_long>,_false>
                 ._M_cur);
      __gnu_cxx::
      __normal_iterator<const_std::unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>_*,_std::vector<std::unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>,_std::allocator<std::unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>_>_>_>
      ::operator++(&__end0);
    }
  }
  else {
    pvVar2 = std::__detail::
             _Node_const_iterator<std::pair<const_yactfr::DataType_*const,_unsigned_long_long>,_false,_false>
             ::operator->((_Node_const_iterator<std::pair<const_yactfr::DataType_*const,_unsigned_long_long>,_false,_false>
                           *)&local_38);
    this_03 = VariantWithIntegerSelectorType<unsigned_long_long>::operator[]
                        (&dt->super_VariantWithIntegerSelectorType<unsigned_long_long>,
                         pvVar2->second);
    pDVar3 = VariantTypeOption<unsigned_long_long>::dataType(this_03);
    _setKeyDts(this,pDVar3,loc,locIt,
               (DataTypeSet *)
               it.
               super__Node_iterator_base<std::pair<const_yactfr::DataType_*const,_unsigned_long_long>,_false>
               ._M_cur);
  }
  return;
}

Assistant:

void _setKeyDtsVar(const VarTypeT& dt, const DataLocation& loc,
                       const DataLocation::PathElements::const_iterator locIt, DataTypeSet& dts) const
    {
        const auto it = _current.find(&dt);

        if (it == _current.end()) {
            // fan out (consider all options)
            for (auto& opt : dt.options()) {
                this->_setKeyDts(opt->dataType(), loc, locIt, dts);
            }
        } else {
            // follow current option only
            this->_setKeyDts(dt[it->second].dataType(), loc, locIt, dts);
        }
    }